

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O2

defV * __thiscall
helics::apps::SineGenerator::generate_abi_cxx11_
          (defV *__return_storage_ptr__,SineGenerator *this,Time signalTime)

{
  long lVar1;
  baseType bVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = signalTime.internalTimeCode - (this->super_SignalGenerator).lastTime.internalTimeCode;
  lVar3 = signalTime.internalTimeCode - (this->lastCycle).internalTimeCode;
  dVar7 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  dVar6 = this->dfdt * dVar7 + this->frequency;
  this->frequency = dVar6;
  dVar8 = dVar7 * this->dAdt + this->amplitude;
  this->amplitude = dVar8;
  dVar7 = this->level;
  dVar5 = sin(((double)(lVar3 % 1000000000) * 1e-09 + (double)(lVar3 / 1000000000)) * dVar6 *
              6.283185307179586 + this->offset);
  uVar4 = -(ulong)(0.0 < this->frequency);
  dVar6 = (double)(~uVar4 & 0x476812f9cf7920e3 | (ulong)(1.0 / this->frequency) & uVar4);
  this->period = dVar6;
  while( true ) {
    bVar2 = count_time<9,_long>::convert(dVar6);
    if (lVar3 <= bVar2) break;
    bVar2 = count_time<9,_long>::convert(this->period);
    lVar3 = lVar3 - bVar2;
    bVar2 = count_time<9,_long>::convert(this->period);
    (this->lastCycle).internalTimeCode = (this->lastCycle).internalTimeCode + bVar2;
    dVar6 = this->period;
  }
  (this->super_SignalGenerator).lastTime.internalTimeCode = signalTime.internalTimeCode;
  *(double *)
   &(__return_storage_ptr__->
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ).
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = dVar8 * dVar5 + dVar7;
  (__return_storage_ptr__->
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ).
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_index = '\0';
  return __return_storage_ptr__;
}

Assistant:

defV SineGenerator::generate(Time signalTime)
    {
        auto dt = signalTime - lastTime;
        auto tdiff = signalTime - lastCycle;
        // account for the frequency shift
        frequency += dfdt * dt;
        amplitude += dAdt * dt;
        // compute the sine wave component
        double newValue = level + amplitude * sin(2.0 * pi * (frequency * tdiff) + offset);
        period = (frequency > 0.0) ? 1.0 / frequency : 1e36;
        while (tdiff > period) {
            tdiff -= period;
            lastCycle += period;
        }
        lastTime = signalTime;
        return newValue;
    }